

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::~BaseCase(BaseCase *this)

{
  BaseCase *this_local;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_032b94e0;
  tcu::ResultCollector::~ResultCollector(&this->m_results);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

virtual					~BaseCase			(void) {}